

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmGhsMultiTargetGenerator::WriteBuildEventsHelper
          (cmGhsMultiTargetGenerator *this,ostream *fout,
          vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *ccv,string *name,string *cmd)

{
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_00;
  cmLocalGenerator *lg;
  bool bVar1;
  reference cc_00;
  string *str;
  ostream *poVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  reference pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *byp;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  cmGeneratedFileStream f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  cmAlphaNum local_300;
  cmAlphaNum local_2d0;
  undefined1 local_2a0 [8];
  string fname;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_260;
  string local_238;
  undefined1 local_218 [8];
  cmCustomCommandGenerator ccg;
  cmCustomCommand *cc;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *__range1;
  string local_90 [8];
  string shell;
  allocator<char> local_59;
  undefined1 local_58 [8];
  string fext;
  int cmdcount;
  string *cmd_local;
  string *name_local;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *ccv_local;
  ostream *fout_local;
  cmGhsMultiTargetGenerator *this_local;
  
  fext.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_58,".sh",&local_59);
  std::allocator<char>::~allocator(&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_90,"/bin/sh ",(allocator<char> *)((long)&__range1 + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  __end1 = std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::begin(ccv);
  cc = (cmCustomCommand *)std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::end(ccv);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
                                *)&cc);
    if (!bVar1) break;
    cc_00 = __gnu_cxx::
            __normal_iterator<const_cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
            ::operator*(&__end1);
    ccg.ComputeInternalDepfile._M_invoker = (_Invoker_type)cc_00;
    std::__cxx11::string::string((string *)&local_238,(string *)&this->ConfigName);
    lg = &this->LocalGenerator->super_cmLocalGenerator;
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional(&local_260);
    this_00 = (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)((long)&fname.field_2 + 8);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function(this_00);
    cmCustomCommandGenerator::cmCustomCommandGenerator
              ((cmCustomCommandGenerator *)local_218,cc_00,&local_238,lg,true,&local_260,this_00);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                 *)((long)&fname.field_2 + 8));
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_260);
    std::__cxx11::string::~string((string *)&local_238);
    str = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                    (&this->LocalGenerator->super_cmLocalGenerator);
    cmAlphaNum::cmAlphaNum(&local_2d0,str);
    cmAlphaNum::cmAlphaNum(&local_300,'/');
    (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xe])
              (&local_320,this->LocalGenerator,this->GeneratorTarget);
    f._615_1_ = 0x2f;
    f._614_1_ = 0x5f;
    f._608_4_ = fext.field_2._12_4_;
    fext.field_2._12_4_ = fext.field_2._12_4_ + 1;
    cmStrCat<std::__cxx11::string,char,std::__cxx11::string,char,std::__cxx11::string,int,std::__cxx11::string>
              ((string *)local_2a0,&local_2d0,&local_300,&local_320,&f.field_0x267,&this->Name,
               &f.field_0x266,name,(int *)&f.field_0x260,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    std::__cxx11::string::~string((string *)&local_320);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)&__range2,(string *)local_2a0,false,None);
    cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)&__range2,true);
    WriteCustomCommandsHelper(this,(ostream *)&__range2,(cmCustomCommandGenerator *)local_218);
    cmGeneratedFileStream::Close((cmGeneratedFileStream *)&__range2);
    if (this->TagType == CUSTOM_TARGET) {
      poVar2 = std::operator<<(fout,(string *)local_2a0);
      poVar2 = std::operator<<(poVar2,"\n    :outputName=\"");
      poVar2 = std::operator<<(poVar2,(string *)local_2a0);
      std::operator<<(poVar2,".rule\"\n");
    }
    else {
      poVar2 = std::operator<<(fout,"    :");
      poVar2 = std::operator<<(poVar2,(string *)cmd);
      poVar2 = std::operator<<(poVar2,"=\"");
      poVar2 = std::operator<<(poVar2,local_90);
      poVar2 = std::operator<<(poVar2,(string *)local_2a0);
      std::operator<<(poVar2,"\"\n");
    }
    this_01 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                        ((cmCustomCommandGenerator *)local_218);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_01);
    byp = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(this_01);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&byp);
      if (!bVar1) break;
      pbVar3 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
      poVar2 = std::operator<<(fout,"    :extraOutputFile=\"");
      poVar2 = std::operator<<(poVar2,(string *)pbVar3);
      std::operator<<(poVar2,"\"\n");
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&__range2);
    std::__cxx11::string::~string((string *)local_2a0);
    cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)local_218);
    __gnu_cxx::
    __normal_iterator<const_cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::WriteBuildEventsHelper(
  std::ostream& fout, const std::vector<cmCustomCommand>& ccv,
  std::string const& name, std::string const& cmd)
{
  int cmdcount = 0;
#ifdef _WIN32
  std::string fext = ".bat";
  std::string shell;
#else
  std::string fext = ".sh";
  std::string shell = "/bin/sh ";
#endif

  for (cmCustomCommand const& cc : ccv) {
    cmCustomCommandGenerator ccg(cc, this->ConfigName, this->LocalGenerator);
    // Open the filestream for this custom command
    std::string fname =
      cmStrCat(this->LocalGenerator->GetCurrentBinaryDirectory(), '/',
               this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget),
               '/', this->Name, '_', name, cmdcount++, fext);

    cmGeneratedFileStream f(fname);
    f.SetCopyIfDifferent(true);
    this->WriteCustomCommandsHelper(f, ccg);
    f.Close();
    if (this->TagType != GhsMultiGpj::CUSTOM_TARGET) {
      fout << "    :" << cmd << "=\"" << shell << fname << "\"\n";
    } else {
      fout << fname << "\n    :outputName=\"" << fname << ".rule\"\n";
    }
    for (const auto& byp : ccg.GetByproducts()) {
      fout << "    :extraOutputFile=\"" << byp << "\"\n";
    }
  }
}